

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

int run_container_get_index(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  uint uVar2;
  rle16_t *prVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  prVar3 = container->runs;
  uVar2 = container->n_runs;
  iVar5 = uVar2 - 1;
  uVar7 = 0;
  do {
    if (iVar5 < (int)uVar7) {
      uVar7 = ~uVar7;
      uVar6 = uVar7;
      break;
    }
    uVar6 = uVar7 + iVar5 >> 1;
    if (prVar3[uVar6].value < x) {
      uVar7 = uVar6 + 1;
      bVar4 = true;
    }
    else if (x < prVar3[uVar6].value) {
      iVar5 = uVar6 - 1;
      bVar4 = true;
    }
    else {
      bVar4 = false;
      container = (run_container_t *)(ulong)uVar6;
    }
    uVar6 = (uint)container;
  } while (bVar4);
  if ((-1 < (int)uVar6) ||
     ((uVar7 = 0xffffffff, uVar6 != 0xffffffff &&
      ((int)((uint)x - (uint)prVar3[-uVar6 - 2].value) <= (int)(uint)prVar3[-uVar6 - 2].length)))) {
    if ((int)uVar2 < 1) {
      uVar7 = 0xffffffff;
    }
    else {
      uVar8 = 0;
      iVar5 = 0;
      do {
        uVar1 = prVar3[uVar8].value;
        uVar6 = (uint)prVar3[uVar8].length + (uint)uVar1;
        if (uVar6 < x) {
          iVar5 = iVar5 + (uint)prVar3[uVar8].length + 1;
          iVar9 = 0;
        }
        else {
          iVar9 = 2;
          if (uVar1 <= x) {
            uVar7 = (iVar5 + (uint)x) - (uint)uVar1;
            iVar9 = 1;
          }
        }
        if (x <= uVar6) goto LAB_0010f33f;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      iVar9 = 2;
LAB_0010f33f:
      if (iVar9 == 2) {
        uVar7 = iVar5 - 1;
      }
    }
  }
  return uVar7;
}

Assistant:

int run_container_get_index(const run_container_t *container, uint16_t x) {
    if (run_container_contains(container, x)) {
        int sum = 0;
        uint32_t x32 = x;
        for (int i = 0; i < container->n_runs; i++) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x <= endpoint) {
                if (x < startpoint) break;
                return sum + (x32 - startpoint);
            } else {
                sum += length + 1;
            }
        }
        return sum - 1;
    } else {
        return -1;
    }
}